

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O1

Sto_Cls_t * Inta_ManPropagate(Inta_Man_t *p,int Start)

{
  uint uVar1;
  int iVar2;
  Sto_Cls_t *pSVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  Sto_Cls_t **ppSVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  Sto_Cls_t *pSVar13;
  timespec ts;
  timespec local_38;
  
  iVar4 = clock_gettime(3,&local_38);
  if (iVar4 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  if (Start < p->nTrailSize) {
    lVar5 = (long)Start;
    do {
      uVar1 = p->pTrail[lVar5];
      pSVar13 = p->pWatches[(int)uVar1];
      if (pSVar13 != (Sto_Cls_t *)0x0) {
        uVar6 = uVar1 ^ 1;
        ppSVar8 = p->pWatches + (int)uVar1;
LAB_004c3bef:
        if (*(uint *)&pSVar13[1].pNext == uVar6) {
          *(undefined4 *)&pSVar13[1].pNext = *(undefined4 *)((long)&pSVar13[1].pNext + 4);
          *(uint *)((long)&pSVar13[1].pNext + 4) = uVar6;
          pSVar3 = pSVar13->pNext0;
          pSVar13->pNext0 = pSVar13->pNext1;
          pSVar13->pNext1 = pSVar3;
        }
        if (*(uint *)((long)&pSVar13[1].pNext + 4) != uVar6) {
          __assert_fail("pCur->pLits[1] == LitF",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satInterA.c"
                        ,0x1b4,"Sto_Cls_t *Inta_ManPropagateOne(Inta_Man_t *, lit)");
        }
        uVar1 = *(uint *)&pSVar13[1].pNext;
        if (uVar1 != p->pAssigns[(int)uVar1 >> 1]) {
          uVar12 = *(uint *)&pSVar13->field_0x1c >> 3 & 0xffffff;
          uVar9 = 2;
          if (2 < uVar12) {
            lVar11 = 0;
            do {
              uVar9 = *(uint *)((long)&pSVar13[1].pNext0 + lVar11 * 4);
              if ((p->pAssigns[(int)uVar9 >> 1] ^ uVar9) != 1) {
                *(uint *)((long)&pSVar13[1].pNext + 4) = uVar9;
                *(uint *)((long)&pSVar13[1].pNext0 + lVar11 * 4) = uVar6;
                *ppSVar8 = pSVar13->pNext1;
                uVar9 = *(uint *)((long)&pSVar13[1].pNext + 4);
                if (((int)uVar9 < 0) || (p->pCnf->nVars <= (int)uVar9 >> 1)) {
                  __assert_fail("lit_check(Lit, p->pCnf->nVars)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bsat/satInterA.c"
                                ,0x15a,"void Inta_ManWatchClause(Inta_Man_t *, Sto_Cls_t *, lit)");
                }
                (&pSVar13->pNext0)[uVar1 != uVar9] = p->pWatches[(ulong)uVar9 ^ 1];
                p->pWatches[uVar9 ^ 1] = pSVar13;
                uVar9 = (int)lVar11 + 2;
                break;
              }
              lVar11 = lVar11 + 1;
              uVar9 = uVar12;
            } while ((ulong)uVar12 - 2 != lVar11);
          }
          if (uVar9 < (*(uint *)&pSVar13->field_0x1c >> 3 & 0xffffff)) goto LAB_004c3d30;
          iVar4 = *(int *)&pSVar13[1].pNext;
          iVar10 = iVar4 >> 1;
          iVar2 = p->pAssigns[iVar10];
          if (iVar2 == -1) {
            p->pAssigns[iVar10] = iVar4;
            p->pReasons[iVar10] = pSVar13;
            iVar2 = p->nTrailSize;
            p->nTrailSize = iVar2 + 1;
            p->pTrail[iVar2] = iVar4;
            goto LAB_004c3d29;
          }
          if (iVar2 != iVar4) goto LAB_004c3d3f;
        }
LAB_004c3d29:
        ppSVar8 = &pSVar13->pNext1;
LAB_004c3d30:
        pSVar13 = *ppSVar8;
        if (pSVar13 == (Sto_Cls_t *)0x0) goto LAB_004c3d3c;
        goto LAB_004c3bef;
      }
LAB_004c3d3c:
      pSVar13 = (Sto_Cls_t *)0x0;
LAB_004c3d3f:
      if (pSVar13 != (Sto_Cls_t *)0x0) {
        iVar4 = clock_gettime(3,&local_38);
        if (iVar4 < 0) {
          lVar5 = -1;
        }
        else {
          lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
        }
        goto LAB_004c3d99;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < p->nTrailSize);
  }
  iVar4 = clock_gettime(3,&local_38);
  if (iVar4 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
  }
  pSVar13 = (Sto_Cls_t *)0x0;
LAB_004c3d99:
  p->timeBcp = p->timeBcp + lVar5 + lVar7;
  return pSVar13;
}

Assistant:

Sto_Cls_t * Inta_ManPropagate( Inta_Man_t * p, int Start )
{
    Sto_Cls_t * pClause;
    int i;
    abctime clk = Abc_Clock();
    for ( i = Start; i < p->nTrailSize; i++ )
    {
        pClause = Inta_ManPropagateOne( p, p->pTrail[i] );
        if ( pClause )
        {
p->timeBcp += Abc_Clock() - clk;
            return pClause;
        }
    }
p->timeBcp += Abc_Clock() - clk;
    return NULL;
}